

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

void __thiscall cppwinrt::writer::save_header(writer *this,char impl)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (settings + 0x60),"winrt/");
  if (impl != '\0') {
    std::__cxx11::string::append((char *)&filename);
  }
  std::__cxx11::string::append((string *)&filename);
  if (impl != '\0') {
    std::__cxx11::string::push_back((char)&filename);
    std::__cxx11::string::push_back((char)&filename);
  }
  std::__cxx11::string::append((char *)&filename);
  writer_base<cppwinrt::writer>::flush_to_file(&this->super_writer_base<cppwinrt::writer>,&filename)
  ;
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void save_header(char impl = 0)
        {
            auto filename{ settings.output_folder + "winrt/" };

            if (impl)
            {
                filename += "impl/";
            }

            filename += type_namespace;

            if (impl)
            {
                filename += '.';
                filename += impl;
            }

            filename += ".h";
            flush_to_file(filename);
        }